

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_fmax_df_mips(CPUMIPSState *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  float_status *status_00;
  int32_t *piVar1;
  byte bVar2;
  int iVar3;
  float32 fVar4;
  uint uVar5;
  uint uVar6;
  float32 fVar7;
  uint uVar8;
  float32 fVar9;
  uint uVar10;
  float32 b;
  uint uVar11;
  ulong a;
  float64 a_00;
  fpr_t *pfVar12;
  float64 fVar13;
  fpr_t *pfVar14;
  float64 fVar15;
  uint32_t unaff_retaddr;
  float_status *status;
  
  status_00 = &(env->active_tc).msa_fp_status;
  pfVar14 = (env->active_fpu).fpr + ws;
  pfVar12 = (env->active_fpu).fpr + wt;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 3) {
    if (((pfVar14->fd & 0x7fffffffffffffff) < 0x7ff0000000000001) &&
       (iVar3 = float64_is_quiet_nan_mips(pfVar12->fd,status_00), iVar3 != 0)) {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar15 = pfVar14->fd;
      a = fVar15;
    }
    else if (((pfVar12->fd & 0x7fffffffffffffff) < 0x7ff0000000000001) &&
            (iVar3 = float64_is_quiet_nan_mips(pfVar14->fd,status_00), iVar3 != 0)) {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar15 = pfVar12->fd;
      a = fVar15;
    }
    else {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar15 = pfVar12->fd;
      a = pfVar14->fd;
    }
    fVar15 = float64_max_mips(a,fVar15,status_00);
    bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
    uVar5 = ieee_ex_to_mips_mips((uint)bVar2);
    uVar10 = (env->active_tc).msacsr;
    uVar8 = (uint)(byte)((byte)((uVar10 & 0x1000000) >> 0x18) & bVar2 >> 6);
    uVar11 = 3;
    if ((uVar10 & 0x1000000) == 0) {
      uVar11 = uVar8;
    }
    if (-1 < (char)bVar2) {
      uVar11 = uVar8;
    }
    uVar11 = uVar11 | uVar5;
    uVar8 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
    uVar6 = uVar8 | uVar11;
    uVar5 = uVar5 & 0xfffffffc;
    if ((uVar8 != 0 || (uVar11 & 1) != 0) || (uVar10 & 0x100) != 0) {
      uVar5 = uVar6;
    }
    if ((uVar11 & 2) == 0) {
      uVar5 = uVar6;
    }
    if ((uVar5 & (uVar10 >> 7 & 0x1f | 0x20)) == 0) {
      uVar11 = uVar5 << 0xc;
LAB_00776c9f:
      (env->active_tc).msacsr = uVar11 & 0x3f000 | uVar10;
    }
    else if ((uVar10 >> 0x12 & 1) == 0) {
      uVar11 = uVar5 << 0xc | uVar10;
      uVar10 = uVar10 & 0xfff80fff;
      goto LAB_00776c9f;
    }
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar5) != 0) {
      fVar15 = float64_default_nan_mips(status_00);
      fVar15 = (long)(int)uVar5 | fVar15 & 0xffffffffffffffc0 ^ 0x8000000000000;
    }
    if (((*(ulong *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8) & 0x7fffffffffffffff) <
         0x7ff0000000000001) &&
       (iVar3 = float64_is_quiet_nan_mips
                          (*(float64 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8),
                           status_00), iVar3 != 0)) {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar13 = *(float64 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
      a_00 = fVar13;
    }
    else if (((*(ulong *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8) & 0x7fffffffffffffff)
              < 0x7ff0000000000001) &&
            (iVar3 = float64_is_quiet_nan_mips
                               (*(float64 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8),
                                status_00), iVar3 != 0)) {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar13 = *(float64 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
      a_00 = fVar13;
    }
    else {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar13 = *(float64 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
      a_00 = *(float64 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    }
    fVar13 = float64_max_mips(a_00,fVar13,status_00);
    bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
    uVar5 = ieee_ex_to_mips_mips((uint)bVar2);
    uVar10 = (env->active_tc).msacsr;
    uVar8 = (uint)(byte)((byte)((uVar10 & 0x1000000) >> 0x18) & bVar2 >> 6);
    uVar11 = 3;
    if ((uVar10 & 0x1000000) == 0) {
      uVar11 = uVar8;
    }
    if (-1 < (char)bVar2) {
      uVar11 = uVar8;
    }
    uVar11 = uVar11 | uVar5;
    uVar8 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
    uVar6 = uVar8 | uVar11;
    uVar5 = uVar5 & 0xfffffffc;
    if ((uVar8 != 0 || (uVar11 & 1) != 0) || (uVar10 & 0x100) != 0) {
      uVar5 = uVar6;
    }
    if ((uVar11 & 2) == 0) {
      uVar5 = uVar6;
    }
    if ((uVar5 & (uVar10 >> 7 & 0x1f | 0x20)) == 0) {
      uVar11 = uVar5 << 0xc;
LAB_00776e0c:
      (env->active_tc).msacsr = uVar11 & 0x3f000 | uVar10;
    }
    else if ((uVar10 >> 0x12 & 1) == 0) {
      uVar11 = uVar5 << 0xc | uVar10;
      uVar10 = uVar10 & 0xfff80fff;
      goto LAB_00776e0c;
    }
    if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar5) != 0) {
      fVar13 = float64_default_nan_mips(status_00);
      fVar13 = (long)(int)uVar5 | fVar13 & 0xffffffffffffffc0 ^ 0x8000000000000;
    }
    goto LAB_007772da;
  }
  if (df != 2) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                  ,0x1abd,
                  "void helper_msa_fmax_df_mips(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                 );
  }
  if (((pfVar14->fs[0] & 0x7fffffff) < 0x7f800001) &&
     (iVar3 = float32_is_quiet_nan_mips(pfVar12->fs[0],status_00), iVar3 != 0)) {
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    uVar10 = pfVar14->fs[0];
    fVar4 = uVar10;
  }
  else if (((pfVar12->fs[0] & 0x7fffffff) < 0x7f800001) &&
          (iVar3 = float32_is_quiet_nan_mips(pfVar14->fs[0],status_00), iVar3 != 0)) {
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    uVar10 = pfVar12->fs[0];
    fVar4 = uVar10;
  }
  else {
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    uVar10 = pfVar14->fs[0];
    fVar4 = pfVar12->fs[0];
  }
  fVar4 = float32_max_mips(uVar10,fVar4,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar5 = ieee_ex_to_mips_mips((uint)bVar2);
  uVar10 = (env->active_tc).msacsr;
  uVar8 = (uint)(byte)((byte)((uVar10 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar11 = 3;
  if ((uVar10 & 0x1000000) == 0) {
    uVar11 = uVar8;
  }
  if (-1 < (char)bVar2) {
    uVar11 = uVar8;
  }
  uVar11 = uVar11 | uVar5;
  uVar8 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
  uVar6 = uVar8 | uVar11;
  uVar5 = uVar5 & 0xfffffffc;
  if ((uVar8 != 0 || (uVar11 & 1) != 0) || (uVar10 & 0x100) != 0) {
    uVar5 = uVar6;
  }
  if ((uVar11 & 2) == 0) {
    uVar5 = uVar6;
  }
  if ((uVar5 & (uVar10 >> 7 & 0x1f | 0x20)) == 0) {
    uVar11 = uVar5 << 0xc;
LAB_00776e5d:
    (env->active_tc).msacsr = uVar11 & 0x3f000 | uVar10;
  }
  else if ((uVar10 >> 0x12 & 1) == 0) {
    uVar11 = uVar5 << 0xc | uVar10;
    uVar10 = uVar10 & 0xfff80fff;
    goto LAB_00776e5d;
  }
  if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar5) != 0) {
    fVar4 = float32_default_nan_mips(status_00);
    fVar4 = fVar4 & 0xffffffc0 ^ 0x400000 | uVar5;
  }
  if (((*(uint *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4) & 0x7fffffff) < 0x7f800001) &&
     (iVar3 = float32_is_quiet_nan_mips
                        (*(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4),status_00)
     , iVar3 != 0)) {
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar7 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
    fVar9 = fVar7;
  }
  else if (((*(uint *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4) & 0x7fffffff) <
            0x7f800001) &&
          (iVar3 = float32_is_quiet_nan_mips
                             (*(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4),
                              status_00), iVar3 != 0)) {
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar7 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
    fVar9 = fVar7;
  }
  else {
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar7 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
    fVar9 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
  }
  fVar7 = float32_max_mips(fVar7,fVar9,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar5 = ieee_ex_to_mips_mips((uint)bVar2);
  uVar10 = (env->active_tc).msacsr;
  uVar8 = (uint)(byte)((byte)((uVar10 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar11 = 3;
  if ((uVar10 & 0x1000000) == 0) {
    uVar11 = uVar8;
  }
  if (-1 < (char)bVar2) {
    uVar11 = uVar8;
  }
  uVar11 = uVar11 | uVar5;
  uVar6 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
  uVar8 = uVar6 | uVar11;
  uVar5 = uVar5 & 0xfffffffc;
  if ((uVar6 != 0 || (uVar11 & 1) != 0) || (uVar10 & 0x100) != 0) {
    uVar5 = uVar8;
  }
  if ((uVar11 & 2) == 0) {
    uVar5 = uVar8;
  }
  if ((uVar5 & (uVar10 >> 7 & 0x1f | 0x20)) == 0) {
    uVar11 = uVar5 << 0xc;
LAB_00776fc0:
    (env->active_tc).msacsr = uVar11 & 0x3f000 | uVar10;
  }
  else if ((uVar10 >> 0x12 & 1) == 0) {
    uVar11 = uVar5 << 0xc | uVar10;
    uVar10 = uVar10 & 0xfff80fff;
    goto LAB_00776fc0;
  }
  if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar5) != 0) {
    fVar7 = float32_default_nan_mips(status_00);
    fVar7 = fVar7 & 0xffffffc0 ^ 0x400000 | uVar5;
  }
  if (((*(uint *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8) & 0x7fffffff) < 0x7f800001) &&
     (iVar3 = float32_is_quiet_nan_mips
                        (*(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8),status_00)
     , iVar3 != 0)) {
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar9 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    b = fVar9;
  }
  else if (((*(uint *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8) & 0x7fffffff) <
            0x7f800001) &&
          (iVar3 = float32_is_quiet_nan_mips
                             (*(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8),
                              status_00), iVar3 != 0)) {
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar9 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
    b = fVar9;
  }
  else {
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar9 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    b = *(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
  }
  fVar9 = float32_max_mips(fVar9,b,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar5 = ieee_ex_to_mips_mips((uint)bVar2);
  uVar10 = (env->active_tc).msacsr;
  uVar8 = (uint)(byte)((byte)((uVar10 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar11 = 3;
  if ((uVar10 & 0x1000000) == 0) {
    uVar11 = uVar8;
  }
  if (-1 < (char)bVar2) {
    uVar11 = uVar8;
  }
  uVar11 = uVar11 | uVar5;
  uVar6 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
  uVar8 = uVar6 | uVar11;
  uVar5 = uVar5 & 0xfffffffc;
  if ((uVar6 != 0 || (uVar11 & 1) != 0) || (uVar10 & 0x100) != 0) {
    uVar5 = uVar8;
  }
  if ((uVar11 & 2) == 0) {
    uVar5 = uVar8;
  }
  if ((uVar5 & (uVar10 >> 7 & 0x1f | 0x20)) == 0) {
    uVar11 = uVar5 << 0xc;
LAB_0077711f:
    (env->active_tc).msacsr = uVar11 & 0x3f000 | uVar10;
  }
  else if ((uVar10 >> 0x12 & 1) == 0) {
    uVar11 = uVar5 << 0xc | uVar10;
    uVar10 = uVar10 & 0xfff80fff;
    goto LAB_0077711f;
  }
  if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar5) != 0) {
    fVar9 = float32_default_nan_mips(status_00);
    fVar9 = fVar9 & 0xffffffc0 ^ 0x400000 | uVar5;
  }
  fVar15 = CONCAT44(fVar7,fVar4);
  if (((*(uint *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc) & 0x7fffffff) < 0x7f800001)
     && (iVar3 = float32_is_quiet_nan_mips
                           (*(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc),
                            status_00), iVar3 != 0)) {
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar4 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
    fVar7 = fVar4;
  }
  else if (((*(uint *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc) & 0x7fffffff) <
            0x7f800001) &&
          (iVar3 = float32_is_quiet_nan_mips
                             (*(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc),
                              status_00), iVar3 != 0)) {
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar4 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
    fVar7 = fVar4;
  }
  else {
    (env->active_tc).msa_fp_status.float_exception_flags = '\0';
    fVar4 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
    fVar7 = *(float32 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
  }
  fVar4 = float32_max_mips(fVar4,fVar7,status_00);
  bVar2 = (env->active_tc).msa_fp_status.float_exception_flags;
  uVar5 = ieee_ex_to_mips_mips((uint)bVar2);
  uVar10 = (env->active_tc).msacsr;
  uVar8 = (uint)(byte)((byte)((uVar10 & 0x1000000) >> 0x18) & bVar2 >> 6);
  uVar11 = 3;
  if ((uVar10 & 0x1000000) == 0) {
    uVar11 = uVar8;
  }
  if (-1 < (char)bVar2) {
    uVar11 = uVar8;
  }
  uVar11 = uVar11 | uVar5;
  uVar6 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
  uVar8 = uVar6 | uVar11;
  uVar5 = uVar5 & 0xfffffffc;
  if ((uVar6 != 0 || (uVar11 & 1) != 0) || (uVar10 & 0x100) != 0) {
    uVar5 = uVar8;
  }
  if ((uVar11 & 2) == 0) {
    uVar5 = uVar8;
  }
  if ((uVar5 & (uVar10 >> 7 & 0x1f | 0x20)) == 0) {
    uVar11 = uVar5 << 0xc;
LAB_00777295:
    (env->active_tc).msacsr = uVar11 & 0x3f000 | uVar10;
  }
  else if ((uVar10 >> 0x12 & 1) == 0) {
    uVar11 = uVar5 << 0xc | uVar10;
    uVar10 = uVar10 & 0xfff80fff;
    goto LAB_00777295;
  }
  if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar5) != 0) {
    fVar4 = float32_default_nan_mips(status_00);
    fVar4 = fVar4 & 0xffffffc0 ^ 0x400000 | uVar5;
  }
  fVar13 = CONCAT44(fVar4,fVar9);
LAB_007772da:
  uVar10 = (env->active_tc).msacsr;
  uVar11 = uVar10 >> 7 & 0x1f | 0x20;
  if ((uVar11 & uVar10 >> 0xc) != 0) {
    do_raise_exception(env,unaff_retaddr,(ulong)uVar11);
  }
  (env->active_tc).msacsr = (uVar10 >> 0xc & 0x1f) << 2 | uVar10;
  (env->active_fpu).fpr[wd].fd = fVar15;
  *(float64 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = fVar13;
  return;
}

Assistant:

void helper_msa_fmax_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
        uint32_t ws, uint32_t wt)
{
     float_status *status = &env->active_tc.msa_fp_status;
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    clear_msacsr_cause(env);

    if (df == DF_WORD) {

        if (NUMBER_QNAN_PAIR(pws->w[0], pwt->w[0], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[0], max, pws->w[0], pws->w[0], 32);
        } else if (NUMBER_QNAN_PAIR(pwt->w[0], pws->w[0], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[0], max, pwt->w[0], pwt->w[0], 32);
        } else {
            MSA_FLOAT_MAXOP(pwx->w[0], max, pws->w[0], pwt->w[0], 32);
        }

        if (NUMBER_QNAN_PAIR(pws->w[1], pwt->w[1], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[1], max, pws->w[1], pws->w[1], 32);
        } else if (NUMBER_QNAN_PAIR(pwt->w[1], pws->w[1], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[1], max, pwt->w[1], pwt->w[1], 32);
        } else {
            MSA_FLOAT_MAXOP(pwx->w[1], max, pws->w[1], pwt->w[1], 32);
        }

        if (NUMBER_QNAN_PAIR(pws->w[2], pwt->w[2], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[2], max, pws->w[2], pws->w[2], 32);
        } else if (NUMBER_QNAN_PAIR(pwt->w[2], pws->w[2], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[2], max, pwt->w[2], pwt->w[2], 32);
        } else {
            MSA_FLOAT_MAXOP(pwx->w[2], max, pws->w[2], pwt->w[2], 32);
        }

        if (NUMBER_QNAN_PAIR(pws->w[3], pwt->w[3], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[3], max, pws->w[3], pws->w[3], 32);
        } else if (NUMBER_QNAN_PAIR(pwt->w[3], pws->w[3], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[3], max, pwt->w[3], pwt->w[3], 32);
        } else {
            MSA_FLOAT_MAXOP(pwx->w[3], max, pws->w[3], pwt->w[3], 32);
        }

    } else if (df == DF_DOUBLE) {

        if (NUMBER_QNAN_PAIR(pws->d[0], pwt->d[0], 64, status)) {
            MSA_FLOAT_MAXOP(pwx->d[0], max, pws->d[0], pws->d[0], 64);
        } else if (NUMBER_QNAN_PAIR(pwt->d[0], pws->d[0], 64, status)) {
            MSA_FLOAT_MAXOP(pwx->d[0], max, pwt->d[0], pwt->d[0], 64);
        } else {
            MSA_FLOAT_MAXOP(pwx->d[0], max, pws->d[0], pwt->d[0], 64);
        }

        if (NUMBER_QNAN_PAIR(pws->d[1], pwt->d[1], 64, status)) {
            MSA_FLOAT_MAXOP(pwx->d[1], max, pws->d[1], pws->d[1], 64);
        } else if (NUMBER_QNAN_PAIR(pwt->d[1], pws->d[1], 64, status)) {
            MSA_FLOAT_MAXOP(pwx->d[1], max, pwt->d[1], pwt->d[1], 64);
        } else {
            MSA_FLOAT_MAXOP(pwx->d[1], max, pws->d[1], pwt->d[1], 64);
        }

    } else {

        assert(0);

    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}